

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedBrs::removeValueFlow(RemoveUnusedBrs *this,Flows *currFlows)

{
  __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  local_50;
  const_iterator local_48;
  Expression ***local_38;
  Expression ***local_30;
  __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  local_28;
  const_iterator local_20;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *local_18;
  Flows *currFlows_local;
  RemoveUnusedBrs *this_local;
  
  local_18 = currFlows;
  currFlows_local = (Flows *)this;
  local_30 = (Expression ***)
             std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                       (currFlows);
  local_38 = (Expression ***)
             std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end(local_18);
  local_28 = std::
             remove_if<__gnu_cxx::__normal_iterator<wasm::Expression***,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>,wasm::RemoveUnusedBrs::removeValueFlow(std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>&)::_lambda(wasm::Expression**)_1_>
                       (local_30,local_38);
  __gnu_cxx::
  __normal_iterator<wasm::Expression**const*,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
  ::__normal_iterator<wasm::Expression***>
            ((__normal_iterator<wasm::Expression**const*,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
              *)&local_20,&local_28);
  local_50._M_current =
       (Expression ***)
       std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end(local_18);
  __gnu_cxx::
  __normal_iterator<wasm::Expression**const*,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
  ::__normal_iterator<wasm::Expression***>
            ((__normal_iterator<wasm::Expression**const*,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>
              *)&local_48,&local_50);
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::erase
            (currFlows,local_20,local_48);
  return;
}

Assistant:

void removeValueFlow(Flows& currFlows) {
    currFlows.erase(std::remove_if(currFlows.begin(),
                                   currFlows.end(),
                                   [&](Expression** currp) {
                                     auto* curr = *currp;
                                     if (auto* ret = curr->dynCast<Return>()) {
                                       return ret->value;
                                     }
                                     return curr->cast<Break>()->value;
                                   }),
                    currFlows.end());
  }